

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::EpsCopyInputStream::Next(EpsCopyInputStream *this,int overrun,int d)

{
  char *pcVar1;
  char *pcVar2;
  undefined8 uVar3;
  bool bVar4;
  uint32 uVar5;
  char *pcVar6;
  size_t __n;
  char *ptr;
  uint32 tag;
  char *local_48;
  uint local_3c;
  unsigned_long local_38;
  
  pcVar2 = this->next_chunk_;
  if (pcVar2 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    pcVar6 = this->buffer_;
    if (pcVar2 == pcVar6) {
      uVar3 = *(undefined8 *)(this->buffer_end_ + 8);
      *(undefined8 *)pcVar6 = *(undefined8 *)this->buffer_end_;
      *(undefined8 *)(this->buffer_ + 8) = uVar3;
      if (this->overall_limit_ < 1) {
LAB_00251aca:
        if (this->aliasing_ == 2) {
          this->aliasing_ = (long)this->buffer_end_ - (long)pcVar2;
        }
        this->next_chunk_ = (char *)0x0;
        this->buffer_end_ = this->buffer_ + 0x10;
        this->size_ = 0;
      }
      else {
        if (-1 < d) {
          local_48 = pcVar6 + overrun;
          pcVar1 = this->buffer_ + 0x10;
LAB_002519d1:
          if (((pcVar1 <= local_48) ||
              (local_48 = ReadTag(local_48,&local_3c,0), local_48 == (char *)0x0)) ||
             (pcVar1 < local_48)) goto switchD_00251a1a_default;
          if (local_3c == 0) goto LAB_00251aca;
          switch(local_3c & 7) {
          case 0:
            goto switchD_00251a1a_caseD_0;
          case 1:
            local_48 = local_48 + 8;
            goto LAB_002519d1;
          case 2:
            uVar5 = ReadSize(&local_48);
            if ((local_48 == (char *)0x0) || ((long)pcVar1 - (long)local_48 < (long)(int)uVar5))
            break;
            local_48 = local_48 + (int)uVar5;
            goto LAB_002519d1;
          case 3:
            d = d + 1;
            goto LAB_002519d1;
          case 4:
            if (d < 1) goto LAB_00251aca;
            d = d + -1;
            goto LAB_002519d1;
          case 5:
            local_48 = local_48 + 4;
            goto LAB_002519d1;
          default:
            break;
          }
        }
switchD_00251a1a_default:
        do {
          bVar4 = StreamNext(this,&local_48);
          if (!bVar4) {
            this->overall_limit_ = 0;
            goto LAB_00251aca;
          }
          __n = (size_t)this->size_;
          if (0x10 < (long)__n) {
            uVar3 = *(undefined8 *)(local_48 + 8);
            *(undefined8 *)(this->buffer_ + 0x10) = *(undefined8 *)local_48;
            *(undefined8 *)(this->buffer_ + 0x18) = uVar3;
            this->next_chunk_ = local_48;
            this->buffer_end_ = this->buffer_ + 0x10;
            if (this->aliasing_ < 2) {
              return pcVar6;
            }
            goto LAB_00251b0f;
          }
        } while (this->size_ < 1);
        memcpy(this->buffer_ + 0x10,local_48,__n);
        this->next_chunk_ = pcVar6;
        this->buffer_end_ = pcVar6 + __n;
        if (1 < this->aliasing_) {
LAB_00251b0f:
          this->aliasing_ = 1;
        }
      }
    }
    else {
      this->buffer_end_ = pcVar2 + (long)this->size_ + -0x10;
      this->next_chunk_ = pcVar6;
      pcVar6 = pcVar2;
      if (this->aliasing_ == 1) {
        this->aliasing_ = 2;
      }
    }
  }
  return pcVar6;
switchD_00251a1a_caseD_0:
  local_48 = VarintParse<unsigned_long>(local_48,&local_38);
  if (local_48 == (char *)0x0) goto switchD_00251a1a_default;
  goto LAB_002519d1;
}

Assistant:

const char* EpsCopyInputStream::Next(int overrun, int d) {
  if (next_chunk_ == nullptr) return nullptr;  // We've reached end of stream.
  if (next_chunk_ != buffer_) {
    GOOGLE_DCHECK(size_ > kSlopBytes);
    // The chunk is large enough to be used directly
    buffer_end_ = next_chunk_ + size_ - kSlopBytes;
    auto res = next_chunk_;
    next_chunk_ = buffer_;
    if (aliasing_ == kOnPatch) aliasing_ = kNoDelta;
    return res;
  }
  // Move the slop bytes of previous buffer to start of the patch buffer.
  // Note we must use memmove because the previous buffer could be part of
  // buffer_.
  std::memmove(buffer_, buffer_end_, kSlopBytes);
  if (overall_limit_ > 0 &&
      (d < 0 || !ParseEndsInSlopRegion(buffer_, overrun, d))) {
    const void* data;
    // ZeroCopyInputStream indicates Next may return 0 size buffers. Hence
    // we loop.
    while (StreamNext(&data)) {
      if (size_ > kSlopBytes) {
        // We got a large chunk
        std::memcpy(buffer_ + kSlopBytes, data, kSlopBytes);
        next_chunk_ = static_cast<const char*>(data);
        buffer_end_ = buffer_ + kSlopBytes;
        if (aliasing_ >= kNoDelta) aliasing_ = kOnPatch;
        return buffer_;
      } else if (size_ > 0) {
        std::memcpy(buffer_ + kSlopBytes, data, size_);
        next_chunk_ = buffer_;
        buffer_end_ = buffer_ + size_;
        if (aliasing_ >= kNoDelta) aliasing_ = kOnPatch;
        return buffer_;
      }
      GOOGLE_DCHECK(size_ == 0) << size_;
    }
    overall_limit_ = 0;  // Next failed, no more needs for next
  }
  // End of stream or array
  if (aliasing_ == kNoDelta) {
    // If there is no more block and aliasing is true, the previous block
    // is still valid and we can alias. We have users relying on string_view's
    // obtained from protos to outlive the proto, when the parse was from an
    // array. This guarantees string_view's are always aliased if parsed from
    // an array.
    aliasing_ = reinterpret_cast<std::uintptr_t>(buffer_end_) -
                reinterpret_cast<std::uintptr_t>(buffer_);
  }
  next_chunk_ = nullptr;
  buffer_end_ = buffer_ + kSlopBytes;
  size_ = 0;
  return buffer_;
}